

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

void __thiscall QByteArrayView::QByteArrayView<11ul>(QByteArrayView *this,char (*data) [11])

{
  qsizetype qVar1;
  
  qVar1 = lengthHelperCharArray(*data,0xb);
  this->m_size = qVar1;
  this->m_data = *data;
  return;
}

Assistant:

constexpr QByteArrayView(const char (&data)[Size]) noexcept
        : QByteArrayView(data, lengthHelperCharArray(data, Size)) {}